

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiprec_convolve_test_util.cc
# Opt level: O1

void __thiscall
libaom_test::AV1HighbdHiprecConvolve::AV1HighbdHiprecConvolveTest::RunCheckOutput
          (AV1HighbdHiprecConvolveTest *this,highbd_hiprec_convolve_func test_impl)

{
  int w;
  int h;
  int iVar1;
  int bd;
  undefined8 uVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ParamType *pPVar7;
  WienerConvolveParams WVar8;
  ulong uVar9;
  uint8_t *dst;
  uint8_t *puVar10;
  int iVar11;
  long lVar12;
  uint8_t *src;
  SEARCH_METHODS *pSVar13;
  long lVar14;
  long lVar15;
  ACMRandom *rnd;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  InterpKernel vkernel;
  InterpKernel hkernel;
  AssertionResult gtest_ar_3;
  int local_b0;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> output2;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> output;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> input;
  AssertHelper local_78;
  uint32_t local_70;
  uint32_t local_6c;
  WienerConvolveParams conv_params;
  
  pPVar7 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  w = *(int *)&(pPVar7->
               super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
               ).
               super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
               .field_0x14;
  pPVar7 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  h = (pPVar7->
      super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
      ).
      super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
      .super__Head_base<1UL,_int,_false>._M_head_impl;
  pPVar7 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  iVar1 = *(int *)&(pPVar7->
                   super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   ).
                   super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .
                   super__Tuple_impl<2UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .
                   super__Tuple_impl<3UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
                   .field_0xc;
  pPVar7 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>_>
           ::GetParam();
  bd = (pPVar7->
       super__Tuple_impl<0UL,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       ).
       super__Tuple_impl<1UL,_int,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       .
       super__Tuple_impl<2UL,_int,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       .
       super__Tuple_impl<3UL,_int,_void_(*)(const_unsigned_char_*,_long,_unsigned_char_*,_long,_const_short_*,_int,_const_short_*,_int,_int,_int,_const_WienerConvolveParams_*,_int)>
       .super__Head_base<3UL,_int,_false>._M_head_impl;
  WVar8.round_0 = bd + -7;
  WVar8.round_1 = 0x15 - bd;
  conv_params.round_0 = 3;
  conv_params.round_1 = 0xb;
  if (10 < bd) {
    conv_params = WVar8;
  }
  input._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
  super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
       operator_new__(0x8000,(nothrow_t *)&std::nothrow);
  vkernel[0] = 0;
  vkernel[1] = 0;
  vkernel[2] = 0;
  vkernel[3] = 0;
  testing::internal::
  CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
            ((internal *)hkernel,"input","nullptr",&input,(void **)vkernel);
  uVar2 = hkernel._8_8_;
  if ((char)hkernel[0] == '\0') {
    testing::Message::Message((Message *)vkernel);
    if (hkernel._8_8_ == 0) {
      pSVar13 = "";
    }
    else {
      pSVar13 = *(SEARCH_METHODS **)hkernel._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
               ,0x10c,(char *)pSVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)vkernel);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (vkernel._0_8_ != 0) {
      (**(code **)(*(long *)vkernel._0_8_ + 8))();
    }
    if (hkernel._8_8_ != 0) {
      if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
        operator_delete(*(void **)hkernel._8_8_);
      }
      operator_delete((void *)hkernel._8_8_);
    }
  }
  else {
    if (hkernel._8_8_ != 0) {
      if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
        operator_delete(*(void **)hkernel._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    iVar4 = (w + 0xfU & 0xfffffff0) * h;
    uVar9 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar9 = (long)iVar4 * 2;
    }
    output._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
    super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
         operator_new__(uVar9,(nothrow_t *)&std::nothrow);
    vkernel[0] = 0;
    vkernel[1] = 0;
    vkernel[2] = 0;
    vkernel[3] = 0;
    testing::internal::
    CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
              ((internal *)hkernel,"output","nullptr",&output,(void **)vkernel);
    uVar2 = hkernel._8_8_;
    if ((char)hkernel[0] == '\0') {
      testing::Message::Message((Message *)vkernel);
      if (hkernel._8_8_ == 0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)hkernel._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                 ,0x113,(char *)pSVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)vkernel);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
      if (vkernel._0_8_ != 0) {
        (**(code **)(*(long *)vkernel._0_8_ + 8))();
      }
      if (hkernel._8_8_ != 0) {
        if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
          operator_delete(*(void **)hkernel._8_8_);
        }
        operator_delete((void *)hkernel._8_8_);
      }
    }
    else {
      if (hkernel._8_8_ != 0) {
        if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
          operator_delete(*(void **)hkernel._8_8_);
        }
        operator_delete((void *)uVar2);
      }
      output2._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
      _M_t.super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
      super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_short,_std::default_delete<unsigned_short[]>,_true,_true>)
           operator_new__(uVar9,(nothrow_t *)&std::nothrow);
      vkernel[0] = 0;
      vkernel[1] = 0;
      vkernel[2] = 0;
      vkernel[3] = 0;
      testing::internal::
      CmpHelperNE<std::unique_ptr<unsigned_short[],std::default_delete<unsigned_short[]>>,decltype(nullptr)>
                ((internal *)hkernel,"output2","nullptr",&output2,(void **)vkernel);
      if ((char)hkernel[0] == '\0') {
        testing::Message::Message((Message *)vkernel);
        if (hkernel._8_8_ == 0) {
          pSVar13 = "";
        }
        else {
          pSVar13 = *(SEARCH_METHODS **)hkernel._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                   ,0x115,(char *)pSVar13);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)vkernel);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
        if (vkernel._0_8_ != 0) {
          (**(code **)(*(long *)vkernel._0_8_ + 8))();
        }
        if (hkernel._8_8_ != 0) {
          gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )hkernel._8_8_;
          if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
            operator_delete(*(void **)hkernel._8_8_);
          }
LAB_004982d6:
          operator_delete((void *)gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        }
      }
      else {
        if (hkernel._8_8_ != 0) {
          if (*(void **)hkernel._8_8_ != (void *)(hkernel._8_8_ + 0x10)) {
            operator_delete(*(void **)hkernel._8_8_);
          }
          operator_delete((void *)hkernel._8_8_);
        }
        rnd = &this->rnd_;
        lVar15 = 0;
        lVar14 = 0;
        do {
          lVar12 = 0;
          do {
            uVar5 = testing::internal::Random::Generate(&rnd->random_,0x80000000);
            *(ushort *)
             ((long)input._M_t.
                    super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                    .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl + lVar15 +
             lVar12 * 2) = (ushort)(uVar5 >> 0xf) & ~(ushort)(-1 << ((byte)bd & 0x1f));
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x80);
          lVar14 = lVar14 + 1;
          lVar15 = lVar15 + 0x100;
        } while (lVar14 != 0x80);
        uVar9 = (ulong)input._M_t.
                       super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                       .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl >> 1;
        dst = (uint8_t *)
              ((ulong)output._M_t.
                      super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                      .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl >> 1);
        puVar10 = (uint8_t *)
                  ((ulong)output2._M_t.
                          super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                          .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl >> 1);
        local_6c = 0x79 - h;
        local_70 = 0x79 - w;
        iVar4 = 0;
        do {
          generate_kernels(rnd,hkernel,vkernel,iVar4);
          if (0 < iVar1) {
            local_b0 = 0;
            do {
              uVar5 = testing::internal::Random::Generate(&rnd->random_,local_6c);
              uVar6 = testing::internal::Random::Generate(&rnd->random_,local_70);
              src = (uint8_t *)((long)(int)uVar6 + (long)(int)(uVar5 * 0x80 + 0x180) + uVar9 + 3);
              av1_highbd_wiener_convolve_add_src_c
                        (src,0x80,dst,(long)w,hkernel,0x10,vkernel,0x10,w,h,&conv_params,bd);
              (*test_impl)(src,0x80,puVar10,(long)w,hkernel,0x10,vkernel,0x10,w,h,&conv_params,bd);
              if (0 < h * w) {
                lVar14 = 0;
                iVar11 = 0;
                do {
                  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                            ((internal *)&gtest_ar_3,"output[j]","output2[j]",
                             (unsigned_short *)
                             ((long)output._M_t.
                                    super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                    .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl +
                             lVar14),(unsigned_short *)
                                     ((long)output2._M_t.
                                            super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                            .super__Head_base<0UL,_unsigned_short_*,_false>.
                                            _M_head_impl + lVar14));
                  uVar3 = gtest_ar_3.message_;
                  if (gtest_ar_3.success_ == false) {
                    testing::Message::Message((Message *)&local_f0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_f0._M_head_impl + 0x10),"Pixel mismatch at index ",
                               0x18);
                    std::ostream::operator<<(local_f0._M_head_impl + 0x10,iVar11);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_f0._M_head_impl + 0x10)," = (",4);
                    std::ostream::operator<<(local_f0._M_head_impl + 0x10,iVar11 % w);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_f0._M_head_impl + 0x10),", ",2);
                    std::ostream::operator<<(local_f0._M_head_impl + 0x10,iVar11 / w);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_f0._M_head_impl + 0x10),") on iteration ",0xf);
                    std::ostream::operator<<(local_f0._M_head_impl + 0x10,local_b0);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pSVar13 = "";
                    }
                    else {
                      pSVar13 = *(SEARCH_METHODS **)
                                 gtest_ar_3.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_78,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/hiprec_convolve_test_util.cc"
                               ,0x12e,(char *)pSVar13);
                    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_f0);
                    testing::internal::AssertHelper::~AssertHelper(&local_78);
                    if (local_f0._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
                    }
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar_3.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) goto LAB_004982de;
                    if (*(void **)gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl !=
                        (void *)((long)gtest_ar_3.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl + 0x10)) {
                      operator_delete(*(void **)gtest_ar_3.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl);
                    }
                    goto LAB_004982d6;
                  }
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar_3.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl !=
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    if (*(void **)gtest_ar_3.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl !=
                        (void *)((long)gtest_ar_3.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl + 0x10)) {
                      operator_delete(*(void **)gtest_ar_3.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl);
                    }
                    operator_delete((void *)uVar3._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
                  }
                  iVar11 = iVar11 + 1;
                  lVar14 = lVar14 + 2;
                } while ((ulong)(uint)(h * w) * 2 != lVar14);
              }
              local_b0 = local_b0 + 1;
            } while (local_b0 != iVar1);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != 6);
      }
LAB_004982de:
      if ((__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)
          output2._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
          ._M_t.super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
          super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)0x0) {
        operator_delete__((void *)output2._M_t.
                                  super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                  .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl);
      }
    }
    if ((__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)
        output._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
        _M_t.super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
        super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)0x0) {
      operator_delete__((void *)output._M_t.
                                super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                                .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl);
    }
  }
  if ((__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)
      input._M_t.super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
      super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>)0x0) {
    operator_delete__((void *)input._M_t.
                              super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                              .super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void AV1HighbdHiprecConvolveTest::RunCheckOutput(
    highbd_hiprec_convolve_func test_impl) {
  const int w = 128, h = 128;
  const int out_w = GET_PARAM(0), out_h = GET_PARAM(1);
  const int num_iters = GET_PARAM(2);
  const int bd = GET_PARAM(3);
  int i, j;
  const WienerConvolveParams conv_params = get_conv_params_wiener(bd);

  std::unique_ptr<uint16_t[]> input(new (std::nothrow) uint16_t[h * w]);
  ASSERT_NE(input, nullptr);

  // The AVX2 convolve functions always write rows with widths that are
  // multiples of 16. So to avoid a buffer overflow, we may need to pad
  // rows to a multiple of 16.
  int output_n = ALIGN_POWER_OF_TWO(out_w, 4) * out_h;
  std::unique_ptr<uint16_t[]> output(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output, nullptr);
  std::unique_ptr<uint16_t[]> output2(new (std::nothrow) uint16_t[output_n]);
  ASSERT_NE(output2, nullptr);

  // Generate random filter kernels
  DECLARE_ALIGNED(16, InterpKernel, hkernel);
  DECLARE_ALIGNED(16, InterpKernel, vkernel);

  for (i = 0; i < h; ++i)
    for (j = 0; j < w; ++j) input[i * w + j] = rnd_.Rand16() & ((1 << bd) - 1);

  uint8_t *input_ptr = CONVERT_TO_BYTEPTR(input.get());
  uint8_t *output_ptr = CONVERT_TO_BYTEPTR(output.get());
  uint8_t *output2_ptr = CONVERT_TO_BYTEPTR(output2.get());
  for (int kernel_type = 0; kernel_type < 6; kernel_type++) {
    generate_kernels(&rnd_, hkernel, vkernel, kernel_type);
    for (i = 0; i < num_iters; ++i) {
      // Choose random locations within the source block
      int offset_r = 3 + rnd_.PseudoUniform(h - out_h - 7);
      int offset_c = 3 + rnd_.PseudoUniform(w - out_w - 7);
      av1_highbd_wiener_convolve_add_src_c(
          input_ptr + offset_r * w + offset_c, w, output_ptr, out_w, hkernel,
          16, vkernel, 16, out_w, out_h, &conv_params, bd);
      test_impl(input_ptr + offset_r * w + offset_c, w, output2_ptr, out_w,
                hkernel, 16, vkernel, 16, out_w, out_h, &conv_params, bd);

      for (j = 0; j < out_w * out_h; ++j)
        ASSERT_EQ(output[j], output2[j])
            << "Pixel mismatch at index " << j << " = (" << (j % out_w) << ", "
            << (j / out_w) << ") on iteration " << i;
    }
  }
}